

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O1

int oonf_packet_send_managed
              (oonf_packet_managed *managed,netaddr_socket *remote,void *data,size_t length)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  oonf_packet_managed *pktsocket;
  ulong uVar4;
  netaddr_str buf;
  
  if ((remote->v4).sin_family == 0) {
    iVar1 = 0;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    iVar1 = 1;
    if ((((managed->socket_v4).scheduler_entry._node.next != (list_entity *)0x0) &&
        ((managed->socket_v4).scheduler_entry._node.prev != (list_entity *)0x0)) &&
       ((remote->v4).sin_family == 2)) {
      iVar1 = oonf_packet_send(&managed->socket_v4,remote,data,length);
    }
    pktsocket = (oonf_packet_managed *)&managed->socket_v6;
    if ((((managed->socket_v6).scheduler_entry._node.next == (list_entity *)0x0) ||
        ((managed->socket_v6).scheduler_entry._node.prev == (list_entity *)0x0)) ||
       ((remote->v4).sin_family != 10)) {
      uVar4 = (ulong)_oonf_packet_socket_subsystem.logging;
      if (((&log_global_mask)[uVar4] & 1) != 0) {
        uVar3 = netaddr_socket_to_string(&buf,remote);
        oonf_log(1,uVar4,"src/base/oonf_packet_socket.c",0x16c,0,0,
                 "Managed socket did not sent packet to %s because socket was not active",uVar3);
      }
    }
    else {
      iVar1 = oonf_packet_send((oonf_packet_socket *)pktsocket,remote,data,length);
    }
    if (*piVar2 == 9) {
      if ((remote->v4).sin_family == 2) {
        pktsocket = managed;
      }
      oonf_packet_remove(&pktsocket->socket_v4,false);
      _apply_managed(managed);
    }
  }
  return iVar1;
}

Assistant:

int
oonf_packet_send_managed(
  struct oonf_packet_managed *managed, union netaddr_socket *remote, const void *data, size_t length) {
  int result;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf;
#endif

  if (netaddr_socket_get_addressfamily(remote) == AF_UNSPEC) {
    return 0;
  }

  result = 1;
  errno = 0;
  if (list_is_node_added(&managed->socket_v4.scheduler_entry._node) &&
      netaddr_socket_get_addressfamily(remote) == AF_INET) {
    result = oonf_packet_send(&managed->socket_v4, remote, data, length);
  }
  if (list_is_node_added(&managed->socket_v6.scheduler_entry._node) &&
      netaddr_socket_get_addressfamily(remote) == AF_INET6) {
    result = oonf_packet_send(&managed->socket_v6, remote, data, length);
  }
  else {
    OONF_DEBUG(LOG_PACKET, "Managed socket did not sent packet to %s because socket was not active",
      netaddr_socket_to_string(&buf, remote));
  }

  if (errno == EBADF) {
    /* file descriptor is not working anymore */
    if (netaddr_socket_get_addressfamily(remote) == AF_INET) {
      oonf_packet_remove(&managed->socket_v4, true);
    }
    else {
      oonf_packet_remove(&managed->socket_v6, true);
    }

    /* try to re-open */
    _apply_managed(managed);
  }
  return result;
}